

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O2

bool __thiscall SessionObjectStore::deleteObject(SessionObjectStore *this,SessionObject *object)

{
  iterator iVar1;
  _Rb_tree_header *p_Var2;
  SessionObject *object_local;
  MutexLocker lock;
  
  object_local = object;
  MutexLocker::MutexLocker(&lock,this->storeMutex);
  iVar1 = std::
          _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
          ::find(&(this->objects)._M_t,&object_local);
  p_Var2 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node == p_Var2) {
    softHSMLog(3,"deleteObject",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/SessionObjectStore.cpp"
               ,0x88,"Cannot delete non-existent object 0x%08X");
  }
  else {
    SessionObject::invalidate(object_local);
    std::
    _Rb_tree<SessionObject_*,_SessionObject_*,_std::_Identity<SessionObject_*>,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
    ::erase(&(this->objects)._M_t,&object_local);
  }
  MutexLocker::~MutexLocker(&lock);
  return (_Rb_tree_header *)iVar1._M_node != p_Var2;
}

Assistant:

bool SessionObjectStore::deleteObject(SessionObject* object)
{
	MutexLocker lock(storeMutex);

	if (objects.find(object) == objects.end())
	{
		ERROR_MSG("Cannot delete non-existent object 0x%08X", object);

		return false;
	}

	// Invalidate the object instance
	object->invalidate();

	objects.erase(object);

	return true;
}